

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qintc.cc
# Opt level: O0

void try_range_check_subtract_real<int>(char *description,bool exp_pass,int *a,int *b)

{
  ostream *poVar1;
  char *local_68;
  range_error *e;
  bool passed;
  int *b_local;
  int *a_local;
  bool exp_pass_local;
  char *description_local;
  
  QIntC::range_check_subtract<int>(a,b);
  poVar1 = std::operator<<((ostream *)&std::cout,description);
  std::operator<<(poVar1,": okay");
  if (exp_pass) {
    local_68 = " PASSED";
  }
  else {
    local_68 = " FAILED";
  }
  poVar1 = std::operator<<((ostream *)&std::cout,local_68);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

static void
try_range_check_subtract_real(char const* description, bool exp_pass, T const& a, T const& b)
{
    bool passed = false;
    try {
        QIntC::range_check_subtract(a, b);
        std::cout << description << ": okay";
        passed = true;
    } catch (std::range_error& e) {
        std::cout << description << ": " << e.what();
        passed = false;
    }
    std::cout << ((passed == exp_pass) ? " PASSED" : " FAILED") << std::endl;
}